

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

void secp256k1_scalar_cadd_bit(secp256k1_scalar *r,uint bit,int flag)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  int vflag;
  
  if (bit < 0x100) {
    uVar8 = flag - 1U & 0x100 | bit;
    uVar7 = uVar8 >> 6;
    bVar5 = (byte)bit;
    uVar4 = (ulong)(uVar8 < 0x40) << (bVar5 & 0x3f);
    uVar9 = (ulong)(uVar7 == 1) << (bVar5 & 0x3f);
    uVar10 = (ulong)(uVar7 == 2) << (bVar5 & 0x3f);
    uVar12 = (ulong)(uVar7 == 3) << (bVar5 & 0x3f);
    uVar2 = r->d[0];
    r->d[0] = r->d[0] + uVar4;
    puVar1 = r->d + 1;
    uVar4 = (ulong)CARRY8(uVar2,uVar4);
    uVar2 = *puVar1;
    uVar3 = *puVar1 + uVar9;
    *puVar1 = uVar3 + uVar4;
    puVar1 = r->d + 2;
    uVar4 = (ulong)(CARRY8(uVar2,uVar9) || CARRY8(uVar3,uVar4));
    uVar2 = *puVar1;
    uVar3 = *puVar1 + uVar10;
    *puVar1 = uVar3 + uVar4;
    puVar1 = r->d + 3;
    uVar4 = (ulong)(CARRY8(uVar2,uVar10) || CARRY8(uVar3,uVar4));
    uVar2 = *puVar1;
    uVar3 = *puVar1 + uVar12;
    *puVar1 = uVar3 + uVar4;
    if (!CARRY8(uVar2,uVar12) && !CARRY8(uVar3,uVar4)) {
      return;
    }
    pcVar11 = "test condition failed: secp256k1_u128_hi_u64(&t) == 0";
    uVar6 = 0x8a;
  }
  else {
    pcVar11 = "test condition failed: bit < 256";
    uVar6 = 0x7b;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/scalar_4x64_impl.h"
          ,uVar6,pcVar11);
  abort();
}

Assistant:

static void secp256k1_scalar_cadd_bit(secp256k1_scalar *r, unsigned int bit, int flag) {
    secp256k1_uint128 t;
    volatile int vflag = flag;
    VERIFY_CHECK(bit < 256);
    bit += ((uint32_t) vflag - 1) & 0x100;  /* forcing (bit >> 6) > 3 makes this a noop */
    secp256k1_u128_from_u64(&t, r->d[0]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 0)) << (bit & 0x3F));
    r->d[0] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[1]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 1)) << (bit & 0x3F));
    r->d[1] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[2]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 2)) << (bit & 0x3F));
    r->d[2] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[3]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 3)) << (bit & 0x3F));
    r->d[3] = secp256k1_u128_to_u64(&t);
#ifdef VERIFY
    VERIFY_CHECK(secp256k1_u128_hi_u64(&t) == 0);
#endif
}